

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

ParsedSchema __thiscall
capnp::SchemaParser::parseDiskFile
          (SchemaParser *this,StringPtr displayName,StringPtr diskPath,
          ArrayPtr<const_kj::StringPtr> importPath)

{
  MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *this_00;
  undefined1 *puVar1;
  map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  *this_01;
  undefined8 *puVar2;
  ReadableDirectory **ppRVar3;
  PathPtr prefix;
  String *pSVar4;
  size_t sVar5;
  char *pcVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar10;
  Clock *clock;
  iterator iVar11;
  StringPtr *extraout_RDX;
  StringPtr *params;
  _Base_ptr p_Var12;
  size_t sVar13;
  Maybe<kj::String> *pMVar14;
  Impl *pIVar15;
  Filesystem *pFVar16;
  void *__arg;
  void *pvVar17;
  ArrayPtr<const_char> *this_02;
  _Base_ptr p_Var18;
  long lVar19;
  Exception *pEVar20;
  long lVar21;
  _Base_ptr *pp_Var22;
  Own<kj::Directory> OVar23;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_bool>
  pVar24;
  ParsedSchema PVar25;
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath_00;
  String result_1;
  Path parsed;
  StringPtr importDir;
  Fault f;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  Array<const_kj::ReadableDirectory_*> result;
  StringPtr pathRef;
  PathPtr cwd;
  pair<const_kj::StringPtr_*,_unsigned_long> importPathKey;
  Path local_218;
  _Base_ptr local_1f8;
  Exception *local_1f0;
  Path *local_1e8;
  map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  *local_1e0;
  pair<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir> local_1d8;
  Path local_188;
  ImportDir local_168;
  size_t local_128;
  ArrayPtr<const_char> *local_120;
  _Base_ptr local_118;
  _Base_ptr p_Stack_110;
  _Rb_tree_color *p_Stack_108;
  Fault local_f8;
  Exception *local_f0;
  void **local_e8;
  undefined8 *local_e0;
  size_t local_d8;
  Impl *local_d0;
  mapped_type *local_c8;
  SchemaParser *local_c0;
  char *local_b8;
  Mutex *local_b0;
  Maybe<capnp::SchemaParser::DiskFileCompat> *local_a8;
  Exception *local_a0;
  Maybe<kj::String> *local_98;
  undefined8 *local_90;
  char local_88;
  _Base_ptr local_80;
  _Base_ptr p_Stack_78;
  _Rb_tree_color *p_Stack_70;
  _Base_ptr local_68;
  _Base_ptr p_Stack_60;
  PathPtr local_50;
  key_type local_40;
  
  __arg = (void *)diskPath.content.size_;
  local_128 = displayName.content.size_;
  pIVar15 = (this->impl).ptr;
  this_00 = &pIVar15->compat;
  kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
  local_a8 = &(pIVar15->compat).value;
  local_b0 = &this_00->mutex;
  if ((pIVar15->compat).value.ptr.isSet == true) {
    pFVar16 = (pIVar15->compat).value.ptr.field_1.value.fs;
  }
  else {
    kj::newDiskFilesystem();
    pFVar16 = (pIVar15->compat).value.ptr.field_1.value.ownFs.ptr;
    (pIVar15->compat).value.ptr.field_1.value.fs = pFVar16;
    puVar1 = (undefined1 *)((long)&(pIVar15->compat).value.ptr.field_1 + 0x20);
    *(undefined4 *)((long)&(pIVar15->compat).value.ptr.field_1 + 0x20) = 0;
    *(undefined8 *)((long)&(pIVar15->compat).value.ptr.field_1 + 0x28) = 0;
    *(undefined1 **)((long)&(pIVar15->compat).value.ptr.field_1 + 0x30) = puVar1;
    *(undefined1 **)((long)&(pIVar15->compat).value.ptr.field_1 + 0x38) = puVar1;
    *(undefined8 *)((long)&(pIVar15->compat).value.ptr.field_1 + 0x40) = 0;
    puVar1 = (undefined1 *)((long)&(pIVar15->compat).value.ptr.field_1 + 0x50);
    *(undefined4 *)((long)&(pIVar15->compat).value.ptr.field_1 + 0x50) = 0;
    *(undefined8 *)((long)&(pIVar15->compat).value.ptr.field_1 + 0x58) = 0;
    *(undefined1 **)((long)&(pIVar15->compat).value.ptr.field_1 + 0x60) = puVar1;
    *(undefined1 **)((long)&(pIVar15->compat).value.ptr.field_1 + 0x68) = puVar1;
    *(undefined8 *)((long)&(pIVar15->compat).value.ptr.field_1 + 0x70) = 0;
    (pIVar15->compat).value.ptr.isSet = true;
  }
  iVar9 = (**pFVar16->_vptr_Filesystem)();
  local_1e8 = (Path *)CONCAT44(extraout_var,iVar9);
  iVar9 = (*((pIVar15->compat).value.ptr.field_1.value.fs)->_vptr_Filesystem[2])();
  local_50.parts.ptr = (String *)CONCAT44(extraout_var_00,iVar9);
  kj::PathPtr::eval(&local_218,&local_50,diskPath);
  local_b8 = displayName.content.ptr;
  if (importPath.size_ == 0) {
    p_Var18 = (_Base_ptr)0x0;
    sVar13 = local_128;
    pEVar20 = (Exception *)0x0;
  }
  else {
    local_120 = &(importPath.ptr)->content;
    local_40.first = importPath.ptr;
    local_40.second = importPath.size_;
    pmVar10 = std::
              map<std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>,_std::less<std::pair<const_kj::StringPtr_*,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>_>_>_>
              ::operator[](&(pIVar15->compat).value.ptr.field_1.value.cachedImportPaths,&local_40);
    local_c0 = this;
    if ((Maybe<kj::String> *)pmVar10->size_ == (Maybe<kj::String> *)0x0) {
      __arg = (void *)0x0;
      local_1f0 = (Exception *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (8,0,importPath.size_,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
      local_e8 = local_1f0->trace + (importPath.size_ - 10);
      local_e0 = &kj::_::HeapArrayDisposer::instance;
      this_01 = &(pIVar15->compat).value.ptr.field_1.value.cachedImportDirs;
      p_Var18 = (_Base_ptr)((long)&(pIVar15->compat).value.ptr.field_1 + 0x20);
      local_1e0 = (map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                   *)&(local_1f0->ownFile).content.size_;
      local_d8 = importPath.size_;
      lVar21 = importPath.size_ << 4;
      lVar19 = 0;
      this_02 = local_120;
      local_1f8 = p_Var18;
      local_f8.exception = local_1f0;
      local_f0 = local_1f0;
      local_d0 = pIVar15;
      local_c8 = pmVar10;
      do {
        iVar11 = std::
                 _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                 ::find(&this_01->_M_t,(key_type *)this_02);
        if (iVar11._M_node == p_Var18) {
          kj::PathPtr::eval(&local_188,&local_50,(StringPtr)*this_02);
          (*(code *)(local_1e8->parts).ptr[3].content.disposer)
                    (&local_1d8,local_1e8,local_188.parts.ptr,local_188.parts.size_);
          params = extraout_RDX;
          if ((_Base_ptr)local_1d8.first.content.size_ == (_Base_ptr)0x0) {
            clock = kj::nullClock();
            OVar23 = kj::newInMemoryDirectory((kj *)&local_1d8,clock);
            params = (StringPtr *)OVar23.ptr;
          }
          p_Var12 = (_Base_ptr)local_1d8.first.content.size_;
          pcVar6 = local_1d8.first.content.ptr;
          local_68 = (_Base_ptr)this_02->ptr;
          p_Stack_60 = (_Base_ptr)this_02->size_;
          kj::str<kj::StringPtr_const&>(&local_168.pathStr,(kj *)this_02,params);
          local_1d8.second.path.parts.size_ = local_188.parts.size_;
          local_1d8.second.path.parts.ptr = local_188.parts.ptr;
          local_168.path.parts.disposer = local_188.parts.disposer;
          local_188.parts.ptr = (String *)0x0;
          local_188.parts.size_ = 0;
          local_168.dir.disposer = (Disposer *)pcVar6;
          local_1d8.first.content.ptr = (char *)local_68;
          local_1d8.first.content.size_ = (size_t)p_Stack_60;
          local_1d8.second.pathStr.content.ptr = local_168.pathStr.content.ptr;
          local_1d8.second.pathStr.content.size_ = local_168.pathStr.content.size_;
          local_1d8.second.pathStr.content.disposer = local_168.pathStr.content.disposer;
          local_168.pathStr.content.ptr = (char *)0x0;
          local_168.pathStr.content.size_ = 0;
          local_1d8.second.path.parts.disposer = local_188.parts.disposer;
          local_168.path.parts.ptr = (String *)0x0;
          local_168.path.parts.size_ = 0;
          local_1d8.second.dir.disposer = (Disposer *)pcVar6;
          local_1d8.second.dir.ptr = (ReadableDirectory *)p_Var12;
          local_168.dir.ptr = (ReadableDirectory *)0x0;
          pVar24 = std::
                   _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                   ::
                   _M_emplace_unique<std::pair<kj::StringPtr,capnp::SchemaParser::DiskFileCompat::ImportDir>>
                             ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                               *)this_01,&local_1d8);
          DiskFileCompat::ImportDir::~ImportDir(&local_1d8.second);
          DiskFileCompat::ImportDir::~ImportDir(&local_168);
          pvVar17 = (void *)local_188.parts.size_;
          pSVar4 = local_188.parts.ptr;
          p_Var18 = local_1f8;
          if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            local_168.pathStr.content.ptr = (char *)0x0;
            local_1d8.first.content.ptr = (char *)0x0;
            local_1d8.first.content.size_ = 0;
            kj::_::Debug::Fault::init
                      ((Fault *)&local_168,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
                      );
            kj::_::Debug::Fault::fatal((Fault *)&local_168);
          }
          if (local_188.parts.ptr != (String *)0x0) {
            local_188.parts.ptr = (String *)0x0;
            local_188.parts.size_ = 0;
            (**(local_188.parts.disposer)->_vptr_ArrayDisposer)
                      (local_188.parts.disposer,pSVar4,0x18,pvVar17,pvVar17,
                       kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
            __arg = pvVar17;
          }
        }
        else {
          p_Var12 = iVar11._M_node[3]._M_parent;
        }
        pmVar10 = local_c8;
        pEVar20 = local_1f0;
        *(_Base_ptr *)((long)local_1f0->trace + lVar19 + -0x50) = p_Var12;
        local_f0 = (Exception *)((long)local_1e0 + lVar19);
        this_02 = this_02 + 1;
        lVar19 = lVar19 + 8;
        lVar21 = lVar21 + -0x10;
      } while (lVar21 != 0);
      pMVar14 = (Maybe<kj::String> *)(lVar19 >> 3);
      local_a0 = local_1f0;
      local_90 = &kj::_::HeapArrayDisposer::instance;
      ppRVar3 = local_c8->ptr;
      local_98 = pMVar14;
      if (ppRVar3 != (ReadableDirectory **)0x0) {
        __arg = (void *)local_c8->size_;
        local_c8->ptr = (ReadableDirectory **)0x0;
        local_c8->size_ = 0;
        (**local_c8->disposer->_vptr_ArrayDisposer)(local_c8->disposer,ppRVar3,8,__arg,__arg,0);
      }
      pmVar10->ptr = (ReadableDirectory **)pEVar20;
      pmVar10->size_ = (size_t)pMVar14;
      pmVar10->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      pIVar15 = local_d0;
      importPath.size_ = local_d8;
      local_1f8 = (_Base_ptr)pMVar14;
    }
    else {
      local_1f0 = (Exception *)pmVar10->ptr;
      local_1f8 = (_Base_ptr)pmVar10->size_;
    }
    local_1e0 = &(pIVar15->compat).value.ptr.field_1.value.cachedImportDirs;
    lVar19 = 0;
    p_Var12 = (_Base_ptr)0x0;
    pp_Var22 = (_Base_ptr *)0x0;
    do {
      puVar2 = (undefined8 *)((long)&local_120->ptr + lVar19);
      local_168.pathStr.content.ptr = (char *)*puVar2;
      local_168.pathStr.content.size_ = puVar2[1];
      iVar11 = std::
               _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
               ::find(&local_1e0->_M_t,(key_type *)&local_168);
      if (iVar11._M_node == (_Base_ptr)((long)&(pIVar15->compat).value.ptr.field_1 + 0x20)) {
        local_f8.exception = (Exception *)0x0;
        local_1d8.first.content.ptr = (char *)0x0;
        local_1d8.first.content.size_ = 0;
        kj::_::Debug::Fault::init
                  (&local_f8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_f8);
      }
      prefix.parts.ptr = (String *)iVar11._M_node[2]._M_parent;
      prefix.parts.size_ = (size_t)iVar11._M_node[2]._M_left;
      local_1d8.first.content.ptr = (char *)local_218.parts.ptr;
      local_1d8.first.content.size_ = local_218.parts.size_;
      bVar8 = kj::PathPtr::startsWith((PathPtr *)&local_1d8,prefix);
      this = local_c0;
      sVar13 = local_128;
      p_Var18 = local_1f8;
      if (bVar8) {
        if (p_Var12 < iVar11._M_node[2]._M_left) {
          p_Var12 = iVar11._M_node[2]._M_left;
          pp_Var22 = &iVar11._M_node[1]._M_left;
        }
      }
      lVar19 = lVar19 + 0x10;
    } while (importPath.size_ * 0x10 != lVar19);
    pEVar20 = local_1f0;
    if (pp_Var22 != (_Base_ptr *)0x0) {
      local_1e8 = (Path *)pp_Var22[7];
      local_168.pathStr.content.ptr =
           (char *)((long)&(local_218.parts.ptr)->content + (long)pp_Var22[4] * 6 * 4);
      local_168.pathStr.content.size_ = local_218.parts.size_ - (long)pp_Var22[4];
      kj::PathPtr::clone((PathPtr *)&local_1d8,(__fn *)&local_168,local_168.pathStr.content.ptr,
                         (int)local_168.pathStr.content.size_,__arg);
      sVar5 = local_218.parts.size_;
      pSVar4 = local_218.parts.ptr;
      if ((_Base_ptr)local_218.parts.ptr != (_Base_ptr)0x0) {
        local_218.parts.ptr = (String *)0x0;
        local_218.parts.size_ = 0;
        (*(code *)*(local_218.parts.disposer)->_vptr_ArrayDisposer)
                  (local_218.parts.disposer,pSVar4,0x18,sVar5,sVar5,
                   kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      }
      local_218.parts.ptr = (String *)local_1d8.first.content.ptr;
      local_218.parts.size_ = local_1d8.first.content.size_;
      local_218.parts.disposer = (ArrayDisposer *)local_1d8.second.pathStr.content.ptr;
      pEVar20 = local_1f0;
    }
  }
  local_118 = (_Base_ptr)local_218.parts.ptr;
  p_Stack_110 = (_Base_ptr)local_218.parts.size_;
  p_Stack_108 = (_Rb_tree_color *)local_218.parts.disposer;
  local_218.parts.ptr = (String *)0x0;
  local_218.parts.size_ = 0;
  sVar13 = sVar13 - 1;
  kj::heapString((String *)&local_1d8,sVar13);
  if (sVar13 != 0) {
    p_Var12 = (_Base_ptr)local_1d8.first.content.size_;
    if ((_Base_ptr)local_1d8.first.content.size_ != (_Base_ptr)0x0) {
      p_Var12 = (_Base_ptr)local_1d8.first.content.ptr;
    }
    memcpy(p_Var12,local_b8,sVar13);
  }
  local_88 = '\x01';
  local_80 = (_Base_ptr)local_1d8.first.content.ptr;
  p_Stack_78 = (_Base_ptr)local_1d8.first.content.size_;
  p_Stack_70 = (_Rb_tree_color *)local_1d8.second.pathStr.content.ptr;
  local_1d8.first.content.ptr = (char *)0x0;
  local_1d8.first.content.size_ = 0;
  importPath_00.size_ = (size_t)pEVar20;
  importPath_00.ptr = (ReadableDirectory **)&local_118;
  SchemaFile::newFromDirectory
            ((ReadableDirectory *)&local_168,local_1e8,importPath_00,(Maybe<kj::String> *)p_Var18);
  PVar25 = parseFile(this,(Own<capnp::SchemaFile> *)&local_168);
  sVar13 = local_168.pathStr.content.size_;
  if ((long *)local_168.pathStr.content.size_ != (long *)0x0) {
    local_168.pathStr.content.size_ = 0;
    (*(code *)**(undefined8 **)local_168.pathStr.content.ptr)
              (local_168.pathStr.content.ptr,sVar13 + *(long *)(*(long *)sVar13 + -0x10));
  }
  p_Var7 = p_Stack_78;
  p_Var12 = local_80;
  if ((local_88 == '\x01') && (local_80 != (_Base_ptr)0x0)) {
    local_80 = (_Base_ptr)0x0;
    p_Stack_78 = (_Base_ptr)0x0;
    (*(code *)**(undefined8 **)p_Stack_70)(p_Stack_70,p_Var12,1,p_Var7,p_Var7,0);
  }
  sVar13 = local_1d8.first.content.size_;
  pcVar6 = local_1d8.first.content.ptr;
  if (local_1d8.first.content.ptr != (char *)0x0) {
    local_1d8.first.content.ptr = (char *)0x0;
    local_1d8.first.content.size_ = 0;
    (*(code *)**(undefined8 **)local_1d8.second.pathStr.content.ptr)
              (local_1d8.second.pathStr.content.ptr,pcVar6,1,sVar13,sVar13,0);
  }
  p_Var7 = p_Stack_110;
  p_Var12 = local_118;
  if (local_118 != (_Base_ptr)0x0) {
    local_118 = (_Base_ptr)0x0;
    p_Stack_110 = (_Base_ptr)0x0;
    (*(code *)**(undefined8 **)p_Stack_108)
              (p_Stack_108,p_Var12,0x18,p_Var7,p_Var7,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  sVar13 = local_218.parts.size_;
  pSVar4 = local_218.parts.ptr;
  if (local_218.parts.ptr != (String *)0x0) {
    local_218.parts.ptr = (String *)0x0;
    local_218.parts.size_ = 0;
    (*(code *)*(local_218.parts.disposer)->_vptr_ArrayDisposer)
              (local_218.parts.disposer,pSVar4,0x18,sVar13,sVar13,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if (local_b0 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(local_b0,EXCLUSIVE);
  }
  return PVar25;
}

Assistant:

ParsedSchema SchemaParser::parseDiskFile(
    kj::StringPtr displayName, kj::StringPtr diskPath,
    kj::ArrayPtr<const kj::StringPtr> importPath) const {
  auto lock = impl->compat.lockExclusive();
  DiskFileCompat* compat;
  KJ_IF_MAYBE(c, *lock) {
    compat = c;
  } else {
    compat = &lock->emplace();
  }